

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void DF_(PDISASM pMyDisasm)

{
  char *pcVar1;
  int iVar2;
  Int32 IVar3;
  ulong uVar4;
  char (*__src) [8];
  byte bVar5;
  uint uVar6;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar2 = Security(2,pMyDisasm);
  if (iVar2 == 0) {
    return;
  }
  bVar5 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  __src = RegistersFPU_Masm;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
    __src = RegistersFPU_Nasm;
  }
  if (0xbf < (ulong)bVar5) {
    uVar4 = (ulong)bVar5 - 0xc0 >> 4;
    if (3 < uVar4) goto LAB_00113994;
    uVar6 = (uint)bVar5;
    switch(uVar4) {
    case 0:
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((bVar5 & 8) == 0) {
        builtin_strncpy(pcVar1,"ffreep",7);
        IVar3 = 0x20012;
      }
      else {
        builtin_strncpy(pcVar1,"fxch7",6);
        (pMyDisasm->Operand2).AccessMode = 2;
        IVar3 = 0x20001;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      break;
    case 1:
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((bVar5 & 8) == 0) {
        builtin_strncpy(pcVar1,"fstp8",6);
      }
      else {
        builtin_strncpy(pcVar1,"fstp9",6);
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      (pMyDisasm->Instruction).Category = 0x20001;
      break;
    case 2:
      if (uVar6 == 0xe0) {
        (pMyDisasm->Instruction).Category = 0x20012;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fstsw",6);
        goto LAB_00113a2a;
      }
      if ((bVar5 & 8) != 0) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fucomip",8);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
        uVar6 = uVar6 & 7;
        goto LAB_00113aa9;
      }
      goto LAB_00113994;
    case 3:
      uVar6 = uVar6 & 0xf;
      if (uVar6 < 8) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fcomip",7);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
LAB_00113aa9:
        strcpy((pMyDisasm->Operand2).OpMnemonic,*__src + (uVar6 << 3));
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = *(Int64 *)((long)REGS + (ulong)(uVar6 << 3));
        (pMyDisasm->Operand2).OpSize = 0x50;
        goto LAB_00113a2a;
      }
LAB_00113994:
      failDecode(pMyDisasm);
      goto LAB_00113a2a;
    }
    uVar4 = (ulong)((uVar6 & 7) << 3);
    strcpy((pMyDisasm->Operand1).OpMnemonic,*__src + uVar4);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = *(Int64 *)((long)REGS + uVar4);
    goto LAB_00113a20;
  }
  bVar5 = bVar5 >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = (uint)bVar5;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  switch(bVar5) {
  case 0:
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    goto LAB_0011390f;
  case 1:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"ttp",4);
    break;
  case 2:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    (pMyDisasm->Instruction).Mnemonic[4] = '\0';
    break;
  case 3:
    (pMyDisasm->Reserved_).MemDecoration = 2;
    goto LAB_00113887;
  case 4:
    (pMyDisasm->Reserved_).MemDecoration = 0x69;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fbld",5);
    goto LAB_00113931;
  case 5:
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
LAB_0011390f:
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fild",5);
LAB_00113931:
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = 1;
LAB_00113a20:
    (pMyDisasm->Operand1).OpSize = 0x50;
    goto LAB_00113a2a;
  case 6:
    (pMyDisasm->Reserved_).MemDecoration = 5;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy(pcVar1,"fbstp",6);
    goto LAB_001138d5;
  case 7:
    (pMyDisasm->Reserved_).MemDecoration = 4;
LAB_00113887:
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    (pMyDisasm->Instruction).Mnemonic[4] = 'p';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  builtin_strncpy(pcVar1,"fist",4);
LAB_001138d5:
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 0x1000;
  (pMyDisasm->Operand2).Registers.fpu = 1;
  (pMyDisasm->Operand2).OpSize = 0x50;
LAB_00113a2a:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ DF_(PDISASM pMyDisasm)
{
  long MyMODRM;
  char (*pRegistersFPU)[8][8] ;

  GV.DECALAGE_EIP = 0;
  if (!Security(2, pMyDisasm)) {return;}
  MyMODRM = *((UInt8*) (GV.EIP_+1));
  pRegistersFPU = &RegistersFPU_Masm;
  if (GV.SYNTAX_ == NasmSyntax) {
      pRegistersFPU = &RegistersFPU_Nasm;
  }
  if (MyMODRM <= 0xbf) {

      GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
      switch (GV.REGOPCODE) {
      case 0:
          GV.MemDecoration = Arg2word;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 1:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 2:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fist");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 3:
          GV.MemDecoration = Arg1word;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 4:
          GV.MemDecoration = Arg2multibytes;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fbld");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 5:
          GV.MemDecoration = Arg2qword;
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REG0;
          pMyDisasm->Operand1.OpSize = 80;
      break;
      case 6:
          GV.MemDecoration = Arg1multibytes;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fbstp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      case 7:
          GV.MemDecoration = Arg1qword;
          decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REG0;
          pMyDisasm->Operand2.OpSize = 80;
      break;
      default:
          failDecode(pMyDisasm);
      }
  }
  else {
      if ((MyMODRM & 0xf0) == 0xc0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ffreep");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxch7");
          #endif
          pMyDisasm->Operand2.AccessMode = WRITE;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = FPU_REG;
        pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
        pMyDisasm->Operand1.OpSize = 80;
      }
      else if ((MyMODRM & 0xf0) == 0xd0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp8");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp9");
          #endif
          pMyDisasm->Operand2.AccessMode = WRITE;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = FPU_REG;
        pMyDisasm->Operand1.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
        pMyDisasm->Operand1.OpSize = 80;

      }
      else if ((MyMODRM & 0xf0) == 0xe0) {
        if (MyMODRM == 0xe0) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstsw");
          #endif
        }
        else if ((MyMODRM & 0xf) >=8) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomip");
          #endif
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REGS[0];
          pMyDisasm->Operand1.OpSize = 80;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
          pMyDisasm->Operand2.OpSize = 80;
        }
        else {
          failDecode(pMyDisasm);
        }
      }

      else if ((MyMODRM & 0xf0) == 0xf0) {
        if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
          pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcomip");
          #endif
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = FPU_REG;
          pMyDisasm->Operand1.Registers.fpu = REGS[0];
          pMyDisasm->Operand1.OpSize = 80;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
          #endif
          pMyDisasm->Operand2.OpType = REGISTER_TYPE;
          pMyDisasm->Operand2.Registers.type = FPU_REG;
          pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
          pMyDisasm->Operand2.OpSize = 80;
        }
        else {
            failDecode(pMyDisasm);
        }
      }
      else {
          failDecode(pMyDisasm);
      }
  }
  GV.EIP_ += GV.DECALAGE_EIP+2;
}